

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::LightningGroup> *
metaf::LightningGroup::fromLtgGroup
          (optional<metaf::LightningGroup> *__return_storage_ptr__,string *group)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> currType;
  bool local_6c;
  bool local_68;
  bool local_60;
  bool local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)group);
  if (iVar2 == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::LightningGroup>._M_payload = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x10) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeUnknown = false;
LAB_001acd9d:
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x24) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x30) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x3c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x48) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.incomplete = false;
    bVar1 = true;
  }
  else {
    if (2 < group->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)group);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (iVar2 == 0) {
        local_6c = false;
        bVar1 = false;
        local_60 = false;
        local_58 = false;
        local_68 = false;
        if (3 < group->_M_string_length) {
          uVar4 = 3;
          local_68 = false;
          local_58 = false;
          local_60 = false;
          bVar1 = false;
          local_6c = false;
          uVar3 = 0;
          do {
            std::__cxx11::string::substr((ulong)local_50,(ulong)group);
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            if (iVar2 == 0) {
              local_58 = true;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_50);
              if (iVar2 == 0) {
                local_60 = true;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)local_50);
                if (iVar2 == 0) {
                  local_68 = true;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar2 == 0) {
                    bVar1 = true;
                  }
                  else {
                    local_6c = true;
                  }
                }
              }
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            uVar4 = uVar4 + 2;
          } while ((uVar4 < group->_M_string_length) &&
                  (bVar5 = uVar3 < 5, uVar3 = uVar3 + 1, bVar5));
        }
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0xc) =
             0;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.dist.distUnit =
             METERS;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudGround =
             local_68;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeInCloud =
             local_58;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudCloud =
             local_60;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudAir =
             bVar1;
        (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload
        .super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeUnknown =
             local_6c;
        goto LAB_001acd9d;
      }
    }
    bVar1 = false;
  }
  (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::LightningGroup>._M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LightningGroup> LightningGroup::fromLtgGroup(const std::string & group) {
	std::optional<LightningGroup> notRecognised;
	static const auto ltgLen = 3u; // length of string LTG
	static const char ltg[ltgLen + 1] = "LTG";

	LightningGroup result;
	if (group == ltg) return (result);

	if (group.length() < ltgLen) return notRecognised;
	if (group.substr(0, ltgLen) != ltg) return notRecognised;

	auto currPos = ltgLen;
	static const auto typeLen = 2;
	static const auto maxLightningTypeCount = 
		6; // arbitrary number greater than 4; well formed group can have max 4 types
	auto lightningTypeCount = 0;
	while(currPos < group.length() && lightningTypeCount < maxLightningTypeCount) {
		const auto currType = group.substr(currPos, typeLen);
		currPos += typeLen;
		lightningTypeCount++;
		if (currType == "IC") { result.typeInCloud = true; continue; }
		if (currType == "CC") { result.typeCloudCloud = true; continue; }
		if (currType == "CG") { result.typeCloudGround = true; continue; }
		if (currType == "CA") { result.typeCloudAir = true; continue; }
		result.typeUnknown = true;
	}
	return result;
}